

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O0

bool __thiscall QString::startsWith(QString *this,QLatin1StringView s,CaseSensitivity cs)

{
  QStringView haystack;
  QLatin1StringView needle;
  bool bVar1;
  char *in_RDX;
  long in_FS_OFFSET;
  undefined4 unaff_retaddr;
  QString *in_stack_ffffffffffffffc8;
  QStringView *in_stack_ffffffffffffffd0;
  CaseSensitivity in_stack_ffffffffffffffd8;
  qsizetype qVar2;
  
  qVar2 = *(qsizetype *)(in_FS_OFFSET + 0x28);
  QStringView::QStringView<QString,_true>(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  haystack.m_data._4_4_ = cs;
  haystack.m_data._0_4_ = unaff_retaddr;
  haystack.m_size = (qsizetype)this;
  needle.m_size = qVar2;
  needle.m_data = in_RDX;
  bVar1 = (anonymous_namespace)::qt_starts_with_impl<QStringView,QLatin1StringView>
                    (haystack,needle,in_stack_ffffffffffffffd8);
  if (*(long *)(in_FS_OFFSET + 0x28) == qVar2) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool QString::startsWith(QLatin1StringView s, Qt::CaseSensitivity cs) const
{
    return qt_starts_with_impl(QStringView(*this), s, cs);
}